

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_xor(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  mp_limb_t *pmVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  mp_ptr pmVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __mpz_struct *p_Var15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  mp_limb_t mVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar10;
  
  uVar9 = u->_mp_size;
  uVar17 = -uVar9;
  if (0 < (int)uVar9) {
    uVar17 = uVar9;
  }
  uVar9 = v->_mp_size;
  uVar4 = -uVar9;
  if (0 < (int)uVar9) {
    uVar4 = uVar9;
  }
  uVar8 = (ulong)uVar4;
  uVar14 = (ulong)uVar17;
  p_Var15 = v;
  if (uVar17 < uVar4) {
    uVar14 = uVar8;
    p_Var15 = u;
    u = v;
    uVar8 = (ulong)uVar17;
  }
  if (uVar8 == 0) {
    mpz_set(r,u);
    return;
  }
  uVar9 = (uint)u->_mp_size >> 0x1f;
  uVar10 = (ulong)uVar9;
  uVar17 = (uint)p_Var15->_mp_size >> 0x1f;
  uVar11 = (ulong)((uint)(p_Var15->_mp_size ^ u->_mp_size) >> 0x1f);
  if ((long)r->_mp_alloc < (long)(uVar14 + uVar11)) {
    pmVar6 = mpz_realloc(r,uVar14 + uVar11);
  }
  else {
    pmVar6 = r->_mp_d;
  }
  uVar7 = -uVar10;
  uVar13 = -uVar11;
  pmVar1 = u->_mp_d;
  pmVar2 = p_Var15->_mp_d;
  uVar12 = 0;
  uVar18 = (ulong)uVar17;
  do {
    uVar16 = uVar18;
    uVar18 = pmVar1[uVar12] ^ uVar7;
    uVar19 = uVar18 + uVar10;
    uVar10 = (ulong)CARRY8(uVar18,uVar10);
    uVar21 = pmVar2[uVar12] ^ -(ulong)uVar17;
    uVar22 = uVar21 + uVar16;
    uVar18 = uVar19 ^ uVar13 ^ uVar22;
    mVar20 = uVar18 + uVar11;
    uVar11 = (ulong)CARRY8(uVar18,uVar11);
    pmVar6[uVar12] = mVar20;
    uVar12 = uVar12 + 1;
    uVar18 = (ulong)CARRY8(uVar21,uVar16);
  } while (uVar8 + (uVar8 == 0) != uVar12);
  if (uVar22 < uVar16) {
    __assert_fail("vc == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xef1,"void mpz_xor(__mpz_struct *, const __mpz_struct *, const __mpz_struct *)")
    ;
  }
  for (; uVar12 < uVar14; uVar12 = uVar12 + 1) {
    uVar8 = pmVar1[uVar12] ^ uVar7;
    uVar18 = uVar8 + uVar10;
    uVar10 = (ulong)CARRY8(uVar8,uVar10);
    uVar18 = uVar18 ^ uVar7;
    mVar20 = uVar18 + uVar11;
    uVar11 = (ulong)CARRY8(uVar18,uVar11);
    pmVar6[uVar12] = mVar20;
  }
  if (uVar11 == 0) {
    if (uVar14 != 0) {
      do {
        if (pmVar6[uVar14 - 1] != 0) goto LAB_00106faa;
        bVar3 = 1 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar3);
      uVar14 = 0;
    }
  }
  else {
    pmVar6[uVar14] = 1;
    uVar14 = uVar14 + 1;
  }
LAB_00106faa:
  iVar5 = -(int)uVar14;
  if (uVar9 == uVar17) {
    iVar5 = (int)uVar14;
  }
  r->_mp_size = iVar5;
  return;
}

Assistant:

void
mpz_xor (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc ^ vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  rp = MPZ_REALLOC (r, un + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = (ul ^ vl ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < un; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = (ul ^ ux) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[un++] = rc;
  else
    un = mpn_normalized_size (rp, un);

  r->_mp_size = rx ? -un : un;
}